

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O0

bool is_limiter(char c)

{
  char i;
  char *__end1;
  char *__begin1;
  char (*__range1) [18];
  bool found;
  char c_local;
  
  __end1 = "@{}*_$=(),<>\\/+-:?Identifier can only contain alphanumeric characters.";
  while( true ) {
    if (__end1 == "Identifier can only contain alphanumeric characters.") {
      return false;
    }
    if (*__end1 == c) break;
    __end1 = __end1 + 1;
  }
  return true;
}

Assistant:

bool is_limiter(char c) {
    bool found = false;
    for (char i : ninx::lexer::LIMITER_CHARS) {
        if (i == c) {
            found = true;
            break;
        }
    }
    return found;
}